

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stack.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  int local_10 [2];
  int test_case;
  
  local_10[1] = 0;
  std::istream::operator>>((istream *)&std::cin,local_10);
  switch(local_10[0]) {
  case 0:
    bVar1 = test0();
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"OK");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    break;
  case 1:
    bVar1 = test1();
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"OK");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    break;
  case 2:
    bVar1 = test2();
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"OK");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    break;
  case 3:
    bVar1 = test3();
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"OK");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    break;
  case 4:
    bVar1 = test4();
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"OK");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    break;
  case 5:
    bVar1 = test5();
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"OK");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    break;
  case 6:
    bVar1 = test6();
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"OK");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    break;
  case 7:
    bVar1 = test7();
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"OK");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    break;
  case 8:
    bVar1 = test8();
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"OK");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    break;
  case 9:
    bVar1 = test9();
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"OK");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return 0;
}

Assistant:

int main() {
  int test_case;
  std::cin >> test_case;
  switch(test_case) {
    case 0: if (test0()) std::cout << "OK" << std::endl; break;
    case 1: if (test1()) std::cout << "OK" << std::endl; break;
    case 2: if (test2()) std::cout << "OK" << std::endl; break;
    case 3: if (test3()) std::cout << "OK" << std::endl; break;
    case 4: if (test4()) std::cout << "OK" << std::endl; break;
    case 5: if (test5()) std::cout << "OK" << std::endl; break;
    case 6: if (test6()) std::cout << "OK" << std::endl; break;
    case 7: if (test7()) std::cout << "OK" << std::endl; break;
    case 8: if (test8()) std::cout << "OK" << std::endl; break;
    case 9: if (test9()) std::cout << "OK" << std::endl; break;
  }

  return 0;
}